

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

void SubscribeToMqttProtocol(PMQTTTRANSPORT_HANDLE_DATA transport_data)

{
  int iVar1;
  char *pcVar2;
  tickcounter_ms_t new_publish_time_ms;
  tickcounter_ms_t current_ms;
  MQTT_MESSAGE_DETAILS_LIST *msg_detail_entry;
  PDLIST_ENTRY current_entry;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  SUBSCRIBE_PAYLOAD subscribe [5];
  size_t sStack_20;
  uint16_t packet_id;
  size_t subscribe_count;
  uint32_t topic_subscription;
  PMQTTTRANSPORT_HANDLE_DATA transport_data_local;
  
  if (transport_data->topics_ToSubscribe == 0) {
    transport_data->currPacketState = PUBLISH_TYPE;
    for (msg_detail_entry =
              (MQTT_MESSAGE_DETAILS_LIST *)(transport_data->telemetry_waitingForAck).Flink;
        msg_detail_entry != (MQTT_MESSAGE_DETAILS_LIST *)&transport_data->telemetry_waitingForAck;
        msg_detail_entry = (MQTT_MESSAGE_DETAILS_LIST *)msg_detail_entry->msgCreationTime) {
      current_ms = (tickcounter_ms_t)&msg_detail_entry[-1].iotHubMessageEntry;
      tickcounter_get_current_ms(transport_data->msgTickCounter,&new_publish_time_ms);
      if (new_publish_time_ms - 57000 < new_publish_time_ms) {
        *(tickcounter_ms_t *)(current_ms + 8) = new_publish_time_ms - 57000;
      }
    }
  }
  else {
    subscribe_count._4_4_ = 0;
    sStack_20 = 0;
    subscribe[4]._14_2_ = getNextPacketId(transport_data);
    if ((transport_data->topic_MqttMessage != (STRING_HANDLE)0x0) &&
       ((transport_data->topics_ToSubscribe & 4) != 0)) {
      l = (LOGGER_LOG)STRING_c_str(transport_data->topic_MqttMessage);
      subscribe[0].subscribeTopic._0_4_ = 1;
      subscribe_count._4_4_ = 4;
      sStack_20 = 1;
    }
    if ((transport_data->topic_GetState != (STRING_HANDLE)0x0) &&
       ((transport_data->topics_ToSubscribe & 1) != 0)) {
      pcVar2 = STRING_c_str(transport_data->topic_GetState);
      *(char **)&subscribe[sStack_20 - 1].qosReturn = pcVar2;
      *(undefined4 *)&subscribe[sStack_20].subscribeTopic = 0;
      subscribe_count._4_4_ = subscribe_count._4_4_ | 1;
      sStack_20 = sStack_20 + 1;
      transport_data->twin_resp_packet_id = subscribe[4]._14_2_;
    }
    if ((transport_data->topic_NotifyState != (STRING_HANDLE)0x0) &&
       ((transport_data->topics_ToSubscribe & 2) != 0)) {
      pcVar2 = STRING_c_str(transport_data->topic_NotifyState);
      *(char **)&subscribe[sStack_20 - 1].qosReturn = pcVar2;
      *(undefined4 *)&subscribe[sStack_20].subscribeTopic = 0;
      subscribe_count._4_4_ = subscribe_count._4_4_ | 2;
      sStack_20 = sStack_20 + 1;
    }
    if ((transport_data->topic_DeviceMethods != (STRING_HANDLE)0x0) &&
       ((transport_data->topics_ToSubscribe & 8) != 0)) {
      pcVar2 = STRING_c_str(transport_data->topic_DeviceMethods);
      *(char **)&subscribe[sStack_20 - 1].qosReturn = pcVar2;
      *(undefined4 *)&subscribe[sStack_20].subscribeTopic = 0;
      subscribe_count._4_4_ = subscribe_count._4_4_ | 8;
      sStack_20 = sStack_20 + 1;
    }
    if ((transport_data->topic_InputQueue != (STRING_HANDLE)0x0) &&
       ((transport_data->topics_ToSubscribe & 0x10) != 0)) {
      pcVar2 = STRING_c_str(transport_data->topic_InputQueue);
      *(char **)&subscribe[sStack_20 - 1].qosReturn = pcVar2;
      *(undefined4 *)&subscribe[sStack_20].subscribeTopic = 1;
      subscribe_count._4_4_ = subscribe_count._4_4_ | 0x10;
      sStack_20 = sStack_20 + 1;
    }
    if (sStack_20 == 0) {
      current_entry = (PDLIST_ENTRY)xlogging_get_log_function();
      if (current_entry != (PDLIST_ENTRY)0x0) {
        (*(code *)current_entry)
                  (0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                   ,"SubscribeToMqttProtocol",0x961,1,"Failure: subscribe_topic is empty.");
      }
    }
    else {
      iVar1 = mqtt_client_subscribe
                        (transport_data->mqttClient,subscribe[4]._14_2_,(SUBSCRIBE_PAYLOAD *)&l,
                         sStack_20);
      if (iVar1 == 0) {
        transport_data->topics_ToSubscribe =
             (subscribe_count._4_4_ ^ 0xffffffff) & transport_data->topics_ToSubscribe;
        transport_data->currPacketState = SUBSCRIBE_TYPE;
      }
      else {
        l_1 = xlogging_get_log_function();
        if (l_1 != (LOGGER_LOG)0x0) {
          (*l_1)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                 ,"SubscribeToMqttProtocol",0x957,1,"Failure: mqtt_client_subscribe returned error."
                );
        }
      }
    }
    transport_data->currPacketState = SUBSCRIBE_TYPE;
  }
  return;
}

Assistant:

static void SubscribeToMqttProtocol(PMQTTTRANSPORT_HANDLE_DATA transport_data)
{
    if (transport_data->topics_ToSubscribe != UNSUBSCRIBE_FROM_TOPIC)
    {
        uint32_t topic_subscription = 0;
        size_t subscribe_count = 0;
        uint16_t packet_id = getNextPacketId(transport_data);
        SUBSCRIBE_PAYLOAD subscribe[SUBSCRIBE_TOPIC_COUNT];
        if ((transport_data->topic_MqttMessage != NULL) && (SUBSCRIBE_TELEMETRY_TOPIC & transport_data->topics_ToSubscribe))
        {
            subscribe[subscribe_count].subscribeTopic = STRING_c_str(transport_data->topic_MqttMessage);
            subscribe[subscribe_count].qosReturn = DELIVER_AT_LEAST_ONCE;
            topic_subscription |= SUBSCRIBE_TELEMETRY_TOPIC;
            subscribe_count++;
        }
        if ((transport_data->topic_GetState != NULL) && (SUBSCRIBE_GET_REPORTED_STATE_TOPIC & transport_data->topics_ToSubscribe))
        {
            subscribe[subscribe_count].subscribeTopic = STRING_c_str(transport_data->topic_GetState);
            subscribe[subscribe_count].qosReturn = DELIVER_AT_MOST_ONCE;
            topic_subscription |= SUBSCRIBE_GET_REPORTED_STATE_TOPIC;
            subscribe_count++;
            transport_data->twin_resp_packet_id = packet_id;
        }
        if ((transport_data->topic_NotifyState != NULL) && (SUBSCRIBE_NOTIFICATION_STATE_TOPIC & transport_data->topics_ToSubscribe))
        {
            subscribe[subscribe_count].subscribeTopic = STRING_c_str(transport_data->topic_NotifyState);
            subscribe[subscribe_count].qosReturn = DELIVER_AT_MOST_ONCE;
            topic_subscription |= SUBSCRIBE_NOTIFICATION_STATE_TOPIC;
            subscribe_count++;
        }
        if ((transport_data->topic_DeviceMethods != NULL) && (SUBSCRIBE_DEVICE_METHOD_TOPIC & transport_data->topics_ToSubscribe))
        {
            subscribe[subscribe_count].subscribeTopic = STRING_c_str(transport_data->topic_DeviceMethods);
            subscribe[subscribe_count].qosReturn = DELIVER_AT_MOST_ONCE;
            topic_subscription |= SUBSCRIBE_DEVICE_METHOD_TOPIC;
            subscribe_count++;
        }
        if ((transport_data->topic_InputQueue != NULL) && (SUBSCRIBE_INPUT_QUEUE_TOPIC & transport_data->topics_ToSubscribe))
        {
            subscribe[subscribe_count].subscribeTopic = STRING_c_str(transport_data->topic_InputQueue);
            subscribe[subscribe_count].qosReturn = DELIVER_AT_LEAST_ONCE;
            topic_subscription |= SUBSCRIBE_INPUT_QUEUE_TOPIC;
            subscribe_count++;
        }

        if (subscribe_count != 0)
        {
            if (mqtt_client_subscribe(transport_data->mqttClient, packet_id, subscribe, subscribe_count) != 0)
            {
                LogError("Failure: mqtt_client_subscribe returned error.");
            }
            else
            {
                transport_data->topics_ToSubscribe &= ~topic_subscription;
                transport_data->currPacketState = SUBSCRIBE_TYPE;
            }
        }
        else
        {
            LogError("Failure: subscribe_topic is empty.");
        }
        transport_data->currPacketState = SUBSCRIBE_TYPE;
    }
    else
    {
        transport_data->currPacketState = PUBLISH_TYPE;

        // On a service reconnect, reset the expired time of messages waiting for a PUBACK.
        // This will cause the messages to republish in order as required by the MQTT spec.
        PDLIST_ENTRY current_entry = transport_data->telemetry_waitingForAck.Flink;
        while (current_entry != &transport_data->telemetry_waitingForAck)
        {
            MQTT_MESSAGE_DETAILS_LIST* msg_detail_entry = containingRecord(current_entry, MQTT_MESSAGE_DETAILS_LIST, entry);
#ifdef RUN_SFC_TESTS
            if (!isMqttMessageSfcType(msg_detail_entry->iotHubMessageEntry->messageHandle))
            {
#endif //RUN_SFC_TESTS
                // Wait for at least MESSAGE_REPUBLISH_TIMEOUT_SECS before republish on new connection
                tickcounter_ms_t current_ms;
                (void)tickcounter_get_current_ms(transport_data->msgTickCounter, &current_ms);
                tickcounter_ms_t new_publish_time_ms = current_ms - ((RESEND_TIMEOUT_VALUE_MIN - MESSAGE_REPUBLISH_TIMEOUT_SECS) * 1000); // force the message to resend
                if (new_publish_time_ms < current_ms)
                {
                    msg_detail_entry->msgPublishTime = new_publish_time_ms;
                }

#ifdef RUN_SFC_TESTS
            }
#endif //RUN_SFC_TESTS
            current_entry = current_entry->Flink;
        }
    }
}